

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cc
# Opt level: O1

int bio_new(BIO *bio)

{
  void *pvVar1;
  
  pvVar1 = OPENSSL_zalloc(0x38);
  if (pvVar1 != (void *)0x0) {
    *(undefined8 *)((long)pvVar1 + 0x20) = 0x4400;
    bio->ptr = pvVar1;
  }
  return (uint)(pvVar1 != (void *)0x0);
}

Assistant:

static int bio_new(BIO *bio) {
  struct bio_bio_st *b =
      reinterpret_cast<bio_bio_st *>(OPENSSL_zalloc(sizeof *b));
  if (b == NULL) {
    return 0;
  }

  b->size = 17 * 1024;  // enough for one TLS record (just a default)
  bio->ptr = b;
  return 1;
}